

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * createResult(DdManager *dd,uint index,uint phase,DdNode *cube,double distance)

{
  int *piVar1;
  DdNode *n;
  DdNode *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  uint uVar5;
  
  if ((index == 0x7fffffff) && (*(int *)((ulong)cube & 0xfffffffffffffffe) == 0x7fffffff)) {
    return cube;
  }
  n = cuddUniqueConst(dd,-distance);
  if (n == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  uVar5 = cube->index;
  pDVar2 = n;
  if (index == 0x7fffffff) {
    pDVar4 = (cube->type).kids.T;
    if (pDVar4 == dd->zero) {
      cube = (cube->type).kids.E;
      index = uVar5;
      goto LAB_00622dfe;
    }
  }
  else {
    iVar3 = 0x7fffffff;
    if (uVar5 != 0x7fffffff) {
      iVar3 = dd->perm[uVar5];
    }
    if (iVar3 <= dd->perm[index]) {
      __assert_fail("cuddI(dd,index) < cuddI(dd,cube->index)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                    ,0x7df,
                    "DdNode *createResult(DdManager *, unsigned int, unsigned int, DdNode *, double)"
                   );
    }
    pDVar4 = cube;
    uVar5 = index;
    if (phase == 0) goto LAB_00622dfe;
  }
  cube = n;
  pDVar2 = pDVar4;
  index = uVar5;
LAB_00622dfe:
  pDVar2 = cuddUniqueInter(dd,index,pDVar2,cube);
  if (pDVar2 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n);
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar2;
}

Assistant:

static DdNode *
createResult(
  DdManager *dd,
  unsigned int index,
  unsigned int phase,
  DdNode *cube,
  CUDD_VALUE_TYPE distance)
{
    DdNode *res, *constant;

    /* Special case.  The cube is either one or zero, and we do not
    ** add any variables.  Hence, the result is also one or zero,
    ** and the distance remains implied by the value of the constant. */
    if (index == CUDD_CONST_INDEX && Cudd_IsConstant(cube)) return(cube);

    constant = cuddUniqueConst(dd,-distance);
    if (constant == NULL) return(NULL);
    cuddRef(constant);

    if (index == CUDD_CONST_INDEX) {
        /* Replace the top node. */
        if (cuddT(cube) == DD_ZERO(dd)) {
            res = cuddUniqueInter(dd,cube->index,constant,cuddE(cube));
        } else {
            res = cuddUniqueInter(dd,cube->index,cuddT(cube),constant);
        }
    } else {
        /* Add a new top node. */
#ifdef DD_DEBUG
        assert(cuddI(dd,index) < cuddI(dd,cube->index));
#endif
        if (phase) {
            res = cuddUniqueInter(dd,index,cube,constant);
        } else {
            res = cuddUniqueInter(dd,index,constant,cube);
        }
    }
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, constant);
        return(NULL);
    }
    cuddDeref(constant); /* safe because constant is part of res */

    return(res);

}